

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

JSON __thiscall json::anon_unknown_1::parse_next(anon_unknown_1 *this,string *str,size_t *offset)

{
  pointer pcVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BackingData __nptr;
  int iVar5;
  mapped_type *this_00;
  char *pcVar6;
  BackingData *pBVar7;
  uint *puVar8;
  long lVar9;
  int *piVar10;
  _Map_pointer ppJVar11;
  size_t sVar12;
  runtime_error *prVar13;
  long *plVar14;
  BackingData this_01;
  undefined8 *puVar15;
  ulong *puVar16;
  ulong *puVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong uVar19;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 uVar20;
  anon_unknown_1 aVar21;
  bool bVar22;
  uint uVar23;
  char cVar24;
  byte bVar25;
  JSON JVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  string val;
  bool b;
  JSON Key;
  JSON Value;
  BackingData local_e8;
  ulong local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  BackingData local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  BackingData local_a0;
  long local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  double local_80;
  BackingData local_78 [2];
  undefined1 local_68 [16];
  BackingData local_58 [2];
  undefined1 local_48 [16];
  double local_38;
  
  consume_ws(str,offset);
  uVar19 = *offset;
  pcVar1 = (str->_M_dataplus)._M_p;
  bVar25 = pcVar1[uVar19];
  cVar24 = (char)&local_e8;
  if (0x6d < bVar25) {
    if (bVar25 == 0x6e) {
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)str);
      iVar5 = std::__cxx11::string::compare((char *)&local_e8.Int);
      uVar20 = extraout_RDX_02;
      if (local_e8.List != (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8) {
        operator_delete(local_e8.List,local_d8._M_allocated_capacity + 1);
        uVar20 = extraout_RDX_03;
      }
      if (iVar5 != 0) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"JSON ERROR: Null: Expected \'null\', found \'","");
        std::__cxx11::string::substr((ulong)local_78,(ulong)str);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a0,&local_c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0.Int);
        local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.List == paVar18) {
          local_d8._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_d8._8_8_ = plVar14[3];
          local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8;
        }
        else {
          local_d8._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_e0 = plVar14[1];
        *plVar14 = (long)paVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::runtime_error::runtime_error(prVar13,(string *)&local_e8.Bool);
        __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *offset = *offset + 4;
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0;
      goto LAB_001f4526;
    }
    if (bVar25 == 0x74) {
LAB_001f3d04:
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0;
      std::__cxx11::string::substr((ulong)&local_e8,(ulong)str);
      iVar5 = std::__cxx11::string::compare((char *)&local_e8.Int);
      if (local_e8.List != (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8) {
        operator_delete(local_e8.List,local_d8._M_allocated_capacity + 1);
      }
      if (iVar5 == 0) {
        *offset = *offset + 4;
        aVar21 = (anon_unknown_1)0x1;
        JSON::SetType((JSON *)this,Boolean);
        uVar20 = extraout_RDX_08;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)str);
        iVar5 = std::__cxx11::string::compare((char *)&local_e8.Int);
        if (local_e8.List != (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8) {
          operator_delete(local_e8.List,local_d8._M_allocated_capacity + 1);
        }
        if (iVar5 != 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,
                     "JSON ERROR: Bool: Expected \'true\' or \'false\', found \'","");
          std::__cxx11::string::substr((ulong)local_78,(ulong)str);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a0,&local_c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0.Int);
          local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.List == paVar18) {
            local_d8._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_d8._8_8_ = plVar14[3];
            local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8;
          }
          else {
            local_d8._M_allocated_capacity = paVar18->_M_allocated_capacity;
          }
          local_e0 = plVar14[1];
          *plVar14 = (long)paVar18;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::runtime_error::runtime_error(prVar13,(string *)&local_e8.Bool);
          __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *offset = *offset + 5;
        JSON::SetType((JSON *)this,Boolean);
        aVar21 = (anon_unknown_1)0x0;
        uVar20 = extraout_RDX_01;
      }
      *this = aVar21;
      goto LAB_001f4526;
    }
    if (bVar25 != 0x7b) goto LAB_001f3f3d;
    *(undefined8 *)this = 0;
    *(undefined4 *)(this + 8) = 0;
    JSON::SetType((JSON *)this,Object);
    *offset = *offset + 1;
    consume_ws(str,offset);
    sVar12 = *offset;
    uVar20 = extraout_RDX;
    if ((str->_M_dataplus)._M_p[sVar12] != '}') {
      if (*offset < str->_M_string_length) {
        do {
          parse_next((anon_unknown_1 *)&local_78[0].Bool,str,offset);
          consume_ws(str,offset);
          if ((str->_M_dataplus)._M_p[*offset] != ':') {
            this_01.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)
                           __cxa_allocate_exception(0x10);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"JSON ERROR: Object: Expected colon, found \'","");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a0,&local_c0,(str->_M_dataplus)._M_p[*offset]);
            puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0.Int);
            auVar3._8_8_ = &local_d8;
            auVar3._0_8_ = puVar15;
            auVar27._8_8_ = (ulong *)*puVar15;
            auVar27._0_8_ = puVar15;
            puVar17 = puVar15 + 2;
            if ((ulong *)*puVar15 != puVar17) goto LAB_001f49bc;
            local_d8._M_allocated_capacity = *puVar17;
            local_d8._8_8_ = puVar15[3];
            goto LAB_001f49c8;
          }
          *offset = *offset + 1;
          consume_ws(str,offset);
          parse_next((anon_unknown_1 *)&local_58[0].Bool,str,offset);
          JSON::ToString_abi_cxx11_((string *)&local_e8,(JSON *)local_78,&local_a0.Bool);
          JSON::SetType((JSON *)this,Object);
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
                    ::operator[](*(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JSON>_>_>
                                   **)this,(key_type *)&local_e8);
          JSON::operator=(this_00,(JSON *)local_58);
          if (local_e8 != &local_d8) {
            operator_delete(local_e8.List,local_d8._M_allocated_capacity + 1);
          }
          consume_ws(str,offset);
          sVar12 = *offset;
          cVar24 = (str->_M_dataplus)._M_p[sVar12];
          if (cVar24 != ',') {
            if (cVar24 != '}') {
              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c0,"JSON ERROR: Object: Expected comma, found \'","");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_a0,&local_c0,(str->_M_dataplus)._M_p[*offset]);
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0.Int);
              local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8.List == paVar18) {
                local_d8._M_allocated_capacity = paVar18->_M_allocated_capacity;
                local_d8._8_8_ = plVar14[3];
                local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8;
              }
              else {
                local_d8._M_allocated_capacity = paVar18->_M_allocated_capacity;
              }
              local_e0 = plVar14[1];
              *plVar14 = (long)paVar18;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              std::runtime_error::runtime_error(prVar13,(string *)&local_e8.Bool);
              __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            *offset = sVar12 + 1;
            JSON::~JSON((JSON *)local_58);
            JSON::~JSON((JSON *)local_78);
            uVar20 = extraout_RDX_11;
            break;
          }
          *offset = sVar12 + 1;
          JSON::~JSON((JSON *)local_58);
          JSON::~JSON((JSON *)local_78);
          uVar20 = extraout_RDX_00;
        } while (*offset < str->_M_string_length);
      }
      goto LAB_001f4526;
    }
LAB_001f44ac:
    *offset = sVar12 + 1;
    goto LAB_001f4526;
  }
  if (bVar25 == 0x22) {
    local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8;
    local_e0 = 0;
    local_d8._M_allocated_capacity = (ulong)(uint7)local_d8._M_allocated_capacity._1_7_ << 8;
    *offset = uVar19 + 1;
    pcVar6 = pcVar1 + uVar19 + 1;
    local_c8 = (BackingData)this;
    while (*pcVar6 == '\\') {
      sVar12 = *offset;
      *offset = sVar12 + 1;
      bVar25 = (str->_M_dataplus)._M_p[sVar12 + 1];
      if (bVar25 < 0x66) goto switchD_001f3e5c_caseD_6f;
      switch(bVar25) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
        break;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
        std::__cxx11::string::append((char *)&local_e8.Int);
        lVar9 = 0;
        do {
          bVar25 = (str->_M_dataplus)._M_p[lVar9 + 1 + *offset];
          if ((9 < (byte)(bVar25 - 0x30)) &&
             ((0x25 < bVar25 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar25 - 0x41) & 0x3f) & 1) == 0)
              ))) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_78[0].List = (deque<json::JSON,_std::allocator<json::JSON>_> *)local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_78,
                       "JSON ERROR: String: Expected hex character in unicode escape, found \'","");
            std::operator+(&local_c0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,bVar25);
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_c0);
            local_a0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0.List == paVar18) {
              local_90._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_90._8_8_ = plVar14[3];
              local_a0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_90;
            }
            else {
              local_90._M_allocated_capacity = paVar18->_M_allocated_capacity;
            }
            local_98 = plVar14[1];
            *plVar14 = (long)paVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::runtime_error::runtime_error(prVar13,(string *)&local_a0.Bool);
            __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::push_back(cVar24);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        *offset = *offset + 4;
        this = (anon_unknown_1 *)local_c8;
        goto LAB_001f3e0e;
      default:
      }
switchD_001f3e5c_caseD_6f:
      std::__cxx11::string::push_back(cVar24);
LAB_001f3e0e:
      sVar12 = *offset;
      *offset = sVar12 + 1;
      pcVar6 = (str->_M_dataplus)._M_p + sVar12 + 1;
    }
    if (*pcVar6 != '\"') goto switchD_001f3e5c_caseD_6f;
    *offset = *offset + 1;
    local_a0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_e8.List,
               (long)&(local_e8.List)->super__Deque_base<json::JSON,_std::allocator<json::JSON>_> +
               local_e0);
    JSON::JSON<std::__cxx11::string>
              ((JSON *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
               (type *)0x0);
    uVar20 = extraout_RDX_06;
    if (local_a0.List != (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_90) {
      operator_delete(local_a0.List,local_90._M_allocated_capacity + 1);
      uVar20 = extraout_RDX_07;
    }
    if (local_e8 == &local_d8) goto LAB_001f4526;
  }
  else {
    if (bVar25 == 0x5b) {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0;
      JSON::SetType((JSON *)this,Array);
      *offset = *offset + 1;
      consume_ws(str,offset);
      sVar12 = *offset;
      uVar20 = extraout_RDX_04;
      if ((str->_M_dataplus)._M_p[sVar12] != ']') {
        if (*offset < str->_M_string_length) {
          uVar23 = 0;
          do {
            parse_next((anon_unknown_1 *)&local_e8.Bool,str,offset);
            pBVar7 = &JSON::operator[]((JSON *)this,(ulong)uVar23)->Internal;
            *pBVar7 = local_e8;
            *(Class *)(pBVar7 + 1) = (Class)local_e0;
            local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)0x0;
            local_e0 = local_e0 & 0xffffffff00000000;
            JSON::~JSON((JSON *)&local_e8);
            consume_ws(str,offset);
            sVar12 = *offset;
            cVar24 = (str->_M_dataplus)._M_p[sVar12];
            uVar20 = extraout_RDX_05;
            if (cVar24 != ',') {
              if (cVar24 != ']') {
                prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_c0,
                           "JSON ERROR: Array: Expected \',\' or \']\', found \'","");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a0,&local_c0,(str->_M_dataplus)._M_p[*offset]);
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_a0.Int);
                local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)*plVar14;
                paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8.List == paVar18) {
                  local_d8._M_allocated_capacity = paVar18->_M_allocated_capacity;
                  local_d8._8_8_ = plVar14[3];
                  local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8;
                }
                else {
                  local_d8._M_allocated_capacity = paVar18->_M_allocated_capacity;
                }
                local_e0 = plVar14[1];
                *plVar14 = (long)paVar18;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                std::runtime_error::runtime_error(prVar13,(string *)&local_e8.Bool);
                __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              goto LAB_001f44ac;
            }
            *offset = sVar12 + 1;
            uVar23 = uVar23 + 1;
          } while (sVar12 + 1 < str->_M_string_length);
        }
        goto LAB_001f4526;
      }
      goto LAB_001f44ac;
    }
    if (bVar25 == 0x66) goto LAB_001f3d04;
LAB_001f3f3d:
    if (bVar25 != 0x2d && 9 < (byte)(bVar25 - 0x30)) {
      this = (anon_unknown_1 *)__cxa_allocate_exception(0x10);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"JSON ERROR: Parse: Unexpected starting character \'","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                     &local_c0,bVar25);
      puVar16 = (ulong *)std::__cxx11::string::append((char *)&local_a0.Int);
      auVar4._8_8_ = &local_d8;
      auVar4._0_8_ = puVar16;
      auVar28._8_8_ = (ulong *)*puVar16;
      auVar28._0_8_ = puVar16;
      puVar17 = puVar16 + 2;
      if ((ulong *)*puVar16 == puVar17) {
        local_d8._M_allocated_capacity = *puVar17;
        local_d8._8_8_ = puVar16[3];
        goto LAB_001f4b00;
      }
LAB_001f4af4:
      local_d8._M_allocated_capacity = *puVar17;
      auVar4 = auVar28;
LAB_001f4b00:
      local_e8 = auVar4._8_8_;
      puVar16 = auVar4._0_8_;
      local_e0 = puVar16[1];
      *puVar16 = (ulong)puVar17;
      puVar16[1] = 0;
      *(undefined1 *)(puVar16 + 2) = 0;
      std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_e8.Bool);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar22 = false;
    *(undefined8 *)this = 0;
    *(undefined4 *)(this + 8) = 0;
    local_e8.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_d8;
    local_e0 = 0;
    local_d8._M_allocated_capacity = (ulong)(uint7)local_d8._M_allocated_capacity._1_7_ << 8;
    local_a0.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_90;
    local_98 = 0;
    local_90._M_allocated_capacity = local_90._M_allocated_capacity & 0xffffffffffffff00;
    bVar25 = 0;
    if (uVar19 < str->_M_string_length) {
      bVar22 = false;
      do {
        *offset = uVar19 + 1;
        bVar25 = (str->_M_dataplus)._M_p[uVar19];
        if (bVar25 == 0x2d || (byte)(bVar25 - 0x30) < 10) {
          std::__cxx11::string::push_back(cVar24);
        }
        else {
          if (bVar25 != 0x2e) break;
          bVar22 = true;
          std::__cxx11::string::push_back(cVar24);
        }
        uVar19 = *offset;
      } while (uVar19 < str->_M_string_length);
    }
    puVar16 = (ulong *)*offset;
    puVar17 = (ulong *)str->_M_string_length;
    if ((bVar25 & 0xdf) == 0x45 && puVar16 < puVar17) {
      *offset = (long)puVar16 + 1;
      bVar25 = *(byte *)((long)puVar16 + (long)(str->_M_dataplus)._M_p);
      puVar17 = (ulong *)(ulong)bVar25;
      if (bVar25 != 0x2b) {
        if (bVar25 == 0x2d) {
          std::__cxx11::string::push_back((char)&local_a0);
        }
        else {
          *offset = (size_t)puVar16;
        }
      }
      while( true ) {
        uVar19 = *offset;
        if (str->_M_string_length <= uVar19) break;
        *offset = uVar19 + 1;
        puVar17 = (ulong *)(str->_M_dataplus)._M_p;
        cVar24 = *(char *)((long)puVar17 + uVar19);
        if (9 < (byte)(cVar24 - 0x30U)) {
          iVar5 = isspace((int)cVar24);
          if ((((iVar5 == 0) && (cVar24 != ',')) && (cVar24 != ']')) && (cVar24 != '}')) {
            local_c8 = (BackingData)this;
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_58[0].List = (deque<json::JSON,_std::allocator<json::JSON>_> *)local_48;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_58,
                       "JSON ERROR: Number: Expected a number for exponent, found \'","");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_58,cVar24);
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_78[0].Int);
            local_c0._M_dataplus._M_p = (pointer)*plVar14;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p == paVar18) {
              local_c0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_c0.field_2._8_8_ = plVar14[3];
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            }
            else {
              local_c0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            }
            local_c0._M_string_length = plVar14[1];
            *plVar14 = (long)paVar18;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::runtime_error::runtime_error(prVar13,(string *)&local_c0);
            __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          break;
        }
        std::__cxx11::string::push_back((char)&local_a0);
      }
      this_01 = local_a0;
      puVar8 = (uint *)__errno_location();
      local_80 = (double)CONCAT44(local_80._4_4_,*puVar8);
      *puVar8 = 0;
      lVar9 = strtol(this_01.Int,(char **)&local_c0,10);
      if ((deque<json::JSON,_std::allocator<json::JSON>_> *)local_c0._M_dataplus._M_p !=
          this_01.List) {
        uVar23 = *puVar8;
        if (uVar23 == 0) {
LAB_001f42e9:
          *puVar8 = local_80._0_4_;
          uVar23 = local_80._0_4_;
        }
        else if (uVar23 == 0x22) {
          local_c8 = (BackingData)this;
          lVar9 = std::__throw_out_of_range("stol");
          goto LAB_001f42e9;
        }
        puVar17 = (ulong *)(ulong)uVar23;
        local_80 = (double)lVar9;
        goto LAB_001f42fb;
      }
LAB_001f499f:
      local_c8 = (BackingData)this;
      std::__throw_invalid_argument("stol");
LAB_001f49b0:
      auVar27 = std::__throw_invalid_argument("stol");
LAB_001f49bc:
      local_d8._M_allocated_capacity = *puVar17;
      auVar3 = auVar27;
LAB_001f49c8:
      local_e8 = auVar3._8_8_;
      puVar15 = auVar3._0_8_;
      local_e0 = puVar15[1];
      *puVar15 = puVar17;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      std::runtime_error::runtime_error((runtime_error *)this_01.List,(string *)&local_e8.Bool);
      __cxa_throw(this_01.List,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_80 = 0.0;
    if (((puVar16 < puVar17) && (iVar5 = isspace((int)(char)bVar25), iVar5 == 0)) &&
       ((bVar25 != 0x2c && ((bVar25 != 0x5d && (bVar25 != 0x7d)))))) {
      local_c8 = (BackingData)this;
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58[0].List = (deque<json::JSON,_std::allocator<json::JSON>_> *)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"JSON ERROR: Number: unexpected character \'","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     bVar25);
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_78[0].Int);
      local_c0._M_dataplus._M_p = (pointer)*plVar14;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == paVar18) {
        local_c0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_c0.field_2._8_8_ = plVar14[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_c0._M_string_length = plVar14[1];
      *plVar14 = (long)paVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::runtime_error::runtime_error(prVar13,(string *)&local_c0);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
LAB_001f42fb:
    __nptr = local_e8;
    *offset = *offset - 1;
    if (bVar22) {
      piVar10 = __errno_location();
      iVar5 = *piVar10;
      *piVar10 = 0;
      this_01.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)&local_c0;
      dVar2 = strtod(__nptr.Float,(char **)this_01.List);
      if ((deque<json::JSON,_std::allocator<json::JSON>_> *)local_c0._M_dataplus._M_p == __nptr.List
         ) {
        local_c8 = (BackingData)this;
        std::__throw_invalid_argument("stod");
        goto LAB_001f499f;
      }
      local_38 = dVar2;
      if (*piVar10 == 0) {
LAB_001f43d0:
        *piVar10 = iVar5;
      }
      else if (*piVar10 == 0x22) {
        local_c8 = (BackingData)this;
        std::__throw_out_of_range("stod");
        goto LAB_001f4360;
      }
      local_80 = pow(10.0,local_80);
      JSON::SetType((JSON *)this,Floating);
      ((BackingData *)
      &((deque<json::JSON,_std::allocator<json::JSON>_> *)this)->
       super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->Float = local_38 * local_80;
      uVar20 = extraout_RDX_09;
    }
    else {
LAB_001f4360:
      lVar9 = local_98;
      this_01 = local_e8;
      local_c8 = (BackingData)this;
      piVar10 = __errno_location();
      if (lVar9 == 0) {
        iVar5 = *piVar10;
        *piVar10 = 0;
        ppJVar11 = (_Map_pointer)strtol((char *)this_01.List,(char **)&local_c0,10);
        this = (anon_unknown_1 *)local_c8;
        if ((deque<json::JSON,_std::allocator<json::JSON>_> *)local_c0._M_dataplus._M_p ==
            this_01.List) {
          auVar28 = std::__throw_invalid_argument("stol");
          goto LAB_001f4af4;
        }
        if (*piVar10 == 0) {
          *piVar10 = iVar5;
        }
        else if (*piVar10 == 0x22) {
          std::__throw_out_of_range("stol");
          goto LAB_001f4462;
        }
        JSON::SetType((JSON *)local_c8.List,Integral);
        (((deque<json::JSON,_std::allocator<json::JSON>_> *)this)->
        super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)._M_impl.super__Deque_impl_data.
        _M_map = ppJVar11;
        uVar20 = extraout_RDX_12;
      }
      else {
        iVar5 = *piVar10;
        *piVar10 = 0;
        ppJVar11 = (_Map_pointer)strtol((char *)this_01.List,(char **)&local_c0,10);
        this = (anon_unknown_1 *)local_c8;
        if ((deque<json::JSON,_std::allocator<json::JSON>_> *)local_c0._M_dataplus._M_p ==
            this_01.List) goto LAB_001f49b0;
        if (*piVar10 == 0) {
LAB_001f4462:
          *piVar10 = iVar5;
        }
        else if (*piVar10 == 0x22) {
          std::__throw_out_of_range("stol");
          goto LAB_001f43d0;
        }
        local_80 = pow(10.0,local_80);
        JSON::SetType((JSON *)this,Floating);
        ((BackingData *)
        &((deque<json::JSON,_std::allocator<json::JSON>_> *)this)->
         super__Deque_base<json::JSON,_std::allocator<json::JSON>_>)->Float =
             local_80 * (double)(long)ppJVar11;
        uVar20 = extraout_RDX_10;
      }
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0.List,local_90._M_allocated_capacity + 1);
      uVar20 = extraout_RDX_13;
    }
    if (local_e8 == &local_d8) goto LAB_001f4526;
  }
  operator_delete(local_e8.List,local_d8._M_allocated_capacity + 1);
  uVar20 = extraout_RDX_14;
LAB_001f4526:
  JVar26._8_8_ = uVar20;
  JVar26.Internal.List = (deque<json::JSON,_std::allocator<json::JSON>_> *)this;
  return JVar26;
}

Assistant:

JSON parse_next( const string &str, size_t &offset ) {
        char value;
        consume_ws( str, offset );
        value = str[offset];
        switch( value ) {
            case '[' : return parse_array( str, offset );
            case '{' : return parse_object( str, offset );
            case '\"': return parse_string( str, offset );
            case 't' :
            case 'f' : return parse_bool( str, offset );
            case 'n' : return parse_null( str, offset );
            default  : if( ( value <= '9' && value >= '0' ) || value == '-' )
                           return parse_number( str, offset );
        }
        throw std::runtime_error(std::string("JSON ERROR: Parse: Unexpected starting character '") + value + "'");
    }